

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

void __thiscall xmrig::Api::genId(Api *this,String *id)

{
  uint16_t uVar1;
  int iVar2;
  size_t sVar3;
  char *__src;
  Config *this_00;
  Http *this_01;
  uint16_t *__s;
  long lVar4;
  String *in_RSI;
  long in_RDI;
  uint8_t *input;
  uint16_t port;
  size_t inSize;
  size_t addrSize;
  uint8_t hash [200];
  int i;
  int count;
  uv_interface_address_t *interfaces;
  uint16_t *size;
  uint8_t *in_stack_fffffffffffffee0;
  int local_20;
  long local_18;
  String *local_10;
  
  local_10 = in_RSI;
  memset((void *)(in_RDI + 0x10),0,0x20);
  sVar3 = String::size(local_10);
  if (sVar3 == 0) {
    iVar2 = uv_interface_addresses(&local_18);
    if (-1 < iVar2) {
      for (local_20 = 0; local_20 < 0; local_20 = local_20 + 1) {
        if ((*(int *)(local_18 + (long)local_20 * 0x50 + 0x10) == 0) &&
           (*(short *)(local_18 + (long)local_20 * 0x50 + 0x14) == 2)) {
          this_00 = Base::config(*(Base **)(in_RDI + 8));
          this_01 = BaseConfig::http(&this_00->super_BaseConfig);
          uVar1 = Http::port(this_01);
          __s = (uint16_t *)operator_new__(0xd);
          memset(__s,0,0xd);
          *__s = uVar1;
          lVar4 = local_18 + (long)local_20 * 0x50;
          *(undefined4 *)(__s + 1) = *(undefined4 *)(lVar4 + 8);
          __s[3] = *(uint16_t *)(lVar4 + 0xc);
          __s[4] = 0x696d;
          __s[5] = 0x656e;
          *(undefined1 *)(__s + 6) = 0x72;
          size = __s;
          keccak(in_stack_fffffffffffffee0,(size_t)__s,(uint8_t *)0x1df2f4);
          Buffer::toHex(in_stack_fffffffffffffee0,(size_t)size,(char *)0x1df30c);
          if (__s != (uint16_t *)0x0) {
            operator_delete__(__s);
          }
          break;
        }
      }
      uv_free_interface_addresses(local_18,0);
    }
  }
  else {
    __src = String::data(local_10);
    strncpy((char *)(in_RDI + 0x10),__src,0x1f);
  }
  return;
}

Assistant:

void xmrig::Api::genId(const String &id)
{
    memset(m_id, 0, sizeof(m_id));

    if (id.size() > 0) {
        strncpy(m_id, id.data(), sizeof(m_id) - 1);
        return;
    }

    uv_interface_address_t *interfaces;
    int count = 0;

    if (uv_interface_addresses(&interfaces, &count) < 0) {
        return;
    }

    for (int i = 0; i < count; i++) {
        if (!interfaces[i].is_internal && interfaces[i].address.address4.sin_family == AF_INET) {
            uint8_t hash[200];
            const size_t addrSize = sizeof(interfaces[i].phys_addr);
            const size_t inSize   = strlen(APP_KIND) + addrSize + sizeof(uint16_t);
            const uint16_t port   = static_cast<uint16_t>(m_base->config()->http().port());

            uint8_t *input = new uint8_t[inSize]();
            memcpy(input, &port, sizeof(uint16_t));
            memcpy(input + sizeof(uint16_t), interfaces[i].phys_addr, addrSize);
            memcpy(input + sizeof(uint16_t) + addrSize, APP_KIND, strlen(APP_KIND));

            keccak(input, inSize, hash);
            Buffer::toHex(hash, 8, m_id);

            delete [] input;
            break;
        }
    }

    uv_free_interface_addresses(interfaces, count);
}